

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoad.h
# Opt level: O2

ChLoad<chrono::fea::ChLoaderBeamWrenchDistributed> * __thiscall
chrono::ChLoad<chrono::fea::ChLoaderBeamWrenchDistributed>::Clone
          (ChLoad<chrono::fea::ChLoaderBeamWrenchDistributed> *this)

{
  ChLoad<chrono::fea::ChLoaderBeamWrenchDistributed> *this_00;
  
  this_00 = (ChLoad<chrono::fea::ChLoaderBeamWrenchDistributed> *)operator_new(0x98);
  ChLoad(this_00,this);
  return this_00;
}

Assistant:

virtual ChLoad* Clone() const override { return new ChLoad(*this); }